

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_composite_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx,
          Bitset *interpolation_qual)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  TypedID<(spirv_cross::Types)1> TVar7;
  uint32_t uVar8;
  uint32_t value;
  TypedID *this_00;
  SPIRType *type;
  size_t sVar9;
  size_type sVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  CompilerError *pCVar13;
  SPIRFunction *pSVar14;
  Vector<std::function<void_()>_> *pVVar15;
  char (*pacVar16) [2];
  bool local_552;
  bool local_513;
  bool local_512;
  bool local_511;
  bool local_501;
  anon_class_152_7_37e15cf1 local_500;
  function<void_()> local_468;
  anon_class_120_7_40024c72 local_448;
  function<void_()> local_3d0;
  byte local_3aa;
  allocator local_3a9;
  string local_3a8;
  string local_388;
  undefined1 local_368 [8];
  string var_chain_1;
  uint32_t local_338;
  uint32_t local_334;
  uint32_t local_330;
  uint32_t local_32c;
  uint32_t local_328;
  BuiltIn local_324;
  BuiltIn local_320;
  uint32_t local_31c;
  BuiltIn local_318;
  BuiltIn local_314;
  uint32_t local_310;
  uint32_t local_30c;
  uint32_t local_308;
  uint32_t local_304;
  uint32_t local_300;
  uint32_t local_2fc;
  uint32_t local_2f8;
  allocator local_2f1;
  string local_2f0;
  byte local_2ca;
  allocator local_2c9;
  string local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [8];
  string mbr_name_1;
  uint32_t local_240;
  uint32_t local_23c;
  uint local_238;
  uint32_t ib_mbr_idx;
  uint32_t i_1;
  uint32_t sub_mbr_idx;
  uint32_t sub_mbr_cnt;
  string local_208;
  undefined1 local_1e8 [8];
  string var_chain;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [8];
  string mbr_name;
  uint32_t i;
  string local_150 [36];
  uint32_t local_12c;
  TypedID<(spirv_cross::Types)1> local_128;
  uint32_t local_124;
  undefined1 local_120 [4];
  uint32_t clip_array_mbr_idx;
  string flatten_from_ib_mbr_name;
  SPIRType *pSStack_f8;
  bool flatten_from_ib_var;
  SPIRType *usable_type;
  uint32_t elem_cnt;
  bool mbr_is_indexable;
  SPIRType *mbr_type;
  uint32_t mbr_type_id;
  undefined1 local_d0 [8];
  Bitset inherited_qual;
  bool is_sample;
  bool is_centroid;
  bool is_noperspective;
  BuiltIn local_5c;
  bool is_flat;
  bool is_builtin;
  SPIRFunction *pSStack_58;
  BuiltIn builtin;
  SPIRFunction *entry_func;
  SPIRType *var_type_local;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *pCStack_28;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  entry_func = (SPIRFunction *)var_type;
  var_type_local = (SPIRType *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local._4_4_ = storage;
  pCStack_28 = this;
  uVar6 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  pSStack_58 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar6);
  local_5c = BuiltInMax;
  bVar2 = Compiler::is_member_builtin((Compiler *)this,(SPIRType *)entry_func,mbr_idx,&local_5c);
  bVar3 = Bitset::get(interpolation_qual,0xe);
  local_501 = true;
  if (!bVar3) {
    TVar7 = TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
    bVar3 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)TVar7.id,mbr_idx,DecorationFlat);
    local_501 = true;
    if (!bVar3) {
      local_501 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(var_type_local->super_IVariant).self.id,
                             DecorationFlat);
    }
  }
  bVar3 = Bitset::get(interpolation_qual,0xd);
  local_511 = true;
  if (!bVar3) {
    TVar7 = TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
    bVar3 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)TVar7.id,mbr_idx,DecorationNoPerspective);
    local_511 = true;
    if (!bVar3) {
      local_511 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(var_type_local->super_IVariant).self.id,
                             DecorationNoPerspective);
    }
  }
  bVar3 = Bitset::get(interpolation_qual,0x10);
  local_512 = true;
  if (!bVar3) {
    TVar7 = TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
    bVar3 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)TVar7.id,mbr_idx,DecorationCentroid);
    local_512 = true;
    if (!bVar3) {
      local_512 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(var_type_local->super_IVariant).self.id,
                             DecorationCentroid);
    }
  }
  bVar3 = Bitset::get(interpolation_qual,0x11);
  local_513 = true;
  if (!bVar3) {
    TVar7 = TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
    bVar3 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)TVar7.id,mbr_idx,DecorationSample);
    local_513 = true;
    if (!bVar3) {
      inherited_qual.higher._M_h._M_single_bucket._4_4_ = (var_type_local->super_IVariant).self.id;
      local_513 = Compiler::has_decoration
                            ((Compiler *)this,inherited_qual.higher._M_h._M_single_bucket._4_4_,
                             DecorationSample);
    }
  }
  Bitset::Bitset((Bitset *)local_d0);
  if (local_501 != false) {
    Bitset::set((Bitset *)local_d0,0xe);
  }
  if (local_511 != false) {
    Bitset::set((Bitset *)local_d0,0xd);
  }
  if (local_512 != false) {
    Bitset::set((Bitset *)local_d0,0x10);
  }
  if (local_513 != false) {
    Bitset::set((Bitset *)local_d0,0x11);
  }
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       ((entry_func->arguments).stack_storage.aligned_char + 0x58),(ulong)mbr_idx);
  uVar6 = TypedID::operator_cast_to_unsigned_int(this_00);
  type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
  bVar3 = false;
  usable_type._0_4_ = 1;
  bVar4 = Compiler::is_matrix((Compiler *)this,type);
  if (bVar4) {
    bVar3 = Compiler::is_array((Compiler *)this,type);
    if (bVar3) {
      pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar13,"MSL cannot emit arrays-of-matrices in input and output variables.");
      __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar3 = true;
    usable_type._0_4_ = type->columns;
  }
  else {
    bVar4 = Compiler::is_array((Compiler *)this,type);
    if (bVar4) {
      sVar9 = VectorView<unsigned_int>::size(&(type->array).super_VectorView<unsigned_int>);
      if (sVar9 != 1) {
        pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar13,"MSL cannot emit arrays-of-arrays in input and output variables.");
        __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar3 = true;
      usable_type._0_4_ = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
    }
  }
  pSStack_f8 = type;
  if ((type->pointer & 1U) != 0) {
    uVar8 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    pSStack_f8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar8);
  }
  while( true ) {
    bVar4 = Compiler::is_array((Compiler *)this,pSStack_f8);
    local_552 = true;
    if (!bVar4) {
      local_552 = Compiler::is_matrix((Compiler *)this,pSStack_f8);
    }
    if (local_552 == false) break;
    uVar8 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_f8->parent_type);
    pSStack_f8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar8);
  }
  flatten_from_ib_mbr_name.field_2._M_local_buf[0xf] = '\0';
  ::std::__cxx11::string::string((string *)local_120);
  if (((ib_var_ref_local._4_4_ == StorageClassOutput) && (bVar2)) &&
     (local_5c == BuiltInClipDistance)) {
    sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       ((var_local->dependees).stack_storage.aligned_char + 0x10));
    local_124 = (uint32_t)sVar9;
    pSVar1 = &var_local->dependees;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_128,uVar6);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
               ((pSVar1->stack_storage).aligned_char + 0x10),&local_128);
    local_12c = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)local_12c,local_124,DecorationBuiltIn,3);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_150,this,3);
    ::std::__cxx11::string::operator=((string *)local_120,local_150);
    ::std::__cxx11::string::~string(local_150);
    TVar7 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_name((Compiler *)this,(TypeID)TVar7.id,local_124,(string *)local_120);
    flatten_from_ib_mbr_name.field_2._M_local_buf[0xf] = '\x01';
    if (((this->msl_options).enable_clip_distance_user_varying & 1U) == 0) goto LAB_0027a151;
  }
  if (type->basetype == Struct) {
    for (mbr_name.field_2._12_4_ = 0; (uint)mbr_name.field_2._12_4_ < (uint32_t)usable_type;
        mbr_name.field_2._12_4_ = mbr_name.field_2._12_4_ + 1) {
      pacVar16 = (char (*) [2])(ulong)mbr_idx;
      pSVar14 = entry_func;
      append_member_name(&local_1a0,this,mbr_name_qual,(SPIRType *)entry_func,mbr_idx);
      var_chain.field_2._M_local_buf[0xe] = '\0';
      if (bVar3) {
        join<char_const(&)[2],unsigned_int&>
                  (&local_1c0,(spirv_cross *)0x490ae3,(char (*) [2])((long)&mbr_name.field_2 + 0xc),
                   (uint *)pSVar14);
      }
      else {
        ::std::allocator<char>::allocator();
        var_chain.field_2._M_local_buf[0xe] = '\x01';
        ::std::__cxx11::string::string
                  ((string *)&local_1c0,"",(allocator *)(var_chain.field_2._M_local_buf + 0xf));
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_180,&local_1a0,&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      if ((var_chain.field_2._M_local_buf[0xe] & 1U) != 0) {
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)(var_chain.field_2._M_local_buf + 0xf));
      }
      ::std::__cxx11::string::~string((string *)&local_1a0);
      CompilerGLSL::to_member_name_abi_cxx11_
                (&local_208,&this->super_CompilerGLSL,(SPIRType *)entry_func,mbr_idx);
      sub_mbr_idx._2_1_ = 0;
      if (bVar3) {
        join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  ((string *)&sub_mbr_cnt,(spirv_cross *)0x48521e,
                   (char (*) [2])((long)&mbr_name.field_2 + 0xc),(uint *)0x490482,pacVar16);
      }
      else {
        ::std::allocator<char>::allocator();
        sub_mbr_idx._2_1_ = 1;
        ::std::__cxx11::string::string
                  ((string *)&sub_mbr_cnt,"",(allocator *)((long)&sub_mbr_idx + 3));
      }
      join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string>
                ((string *)local_1e8,(spirv_cross *)var_chain_qual,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4aff3f,
                 (char (*) [2])&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sub_mbr_cnt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)var_type);
      ::std::__cxx11::string::~string((string *)&sub_mbr_cnt);
      if ((sub_mbr_idx._2_1_ & 1) != 0) {
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&sub_mbr_idx + 3));
      }
      ::std::__cxx11::string::~string((string *)&local_208);
      sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        (&(type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      i_1 = (uint32_t)sVar9;
      for (ib_mbr_idx = 0; ib_mbr_idx < i_1; ib_mbr_idx = ib_mbr_idx + 1) {
        var_type = type;
        add_composite_member_variable_to_interface_block
                  (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local,
                   (SPIRVariable *)var_type_local,type,ib_mbr_idx,meta,(string *)local_180,
                   (string *)local_1e8,location,var_mbr_idx,(Bitset *)local_d0);
        *var_mbr_idx = *var_mbr_idx + 1;
      }
      ::std::__cxx11::string::~string((string *)local_1e8);
      ::std::__cxx11::string::~string((string *)local_180);
    }
  }
  else {
    for (local_238 = 0; local_238 < (uint32_t)usable_type; local_238 = local_238 + 1) {
      sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                         ((var_local->dependees).stack_storage.aligned_char + 0x10));
      local_23c = (uint32_t)sVar9;
      bVar4 = false;
      if (ib_var_ref_local._4_4_ == StorageClassInput) {
        local_240 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(var_type_local->super_IVariant).self);
        sVar10 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count(&this->pull_model_inputs,&local_240);
        bVar4 = sVar10 != 0;
      }
      if (bVar4) {
        pSVar1 = &var_local->dependees;
        uVar6 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_f8->super_IVariant).self);
        uVar6 = build_msl_interpolant_type(this,uVar6,local_511);
        TypedID<(spirv_cross::Types)1>::TypedID
                  ((TypedID<(spirv_cross::Types)1> *)((long)&mbr_name_1.field_2 + 0xc),uVar6);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                   ((pSVar1->stack_storage).aligned_char + 0x10),
                   (TypedID<(spirv_cross::Types)1> *)((long)&mbr_name_1.field_2 + 0xc));
      }
      else {
        pSVar1 = &var_local->dependees;
        mbr_name_1.field_2._8_4_ =
             TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_f8->super_IVariant).self);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                   ((pSVar1->stack_storage).aligned_char + 0x10),
                   (TypedID<(spirv_cross::Types)1> *)((long)&mbr_name_1.field_2 + 8));
      }
      pSVar14 = entry_func;
      append_member_name(&local_2a8,this,mbr_name_qual,(SPIRType *)entry_func,mbr_idx);
      local_2ca = 0;
      if (bVar3) {
        join<char_const(&)[2],unsigned_int&>
                  (&local_2c8,(spirv_cross *)0x490ae3,(char (*) [2])&local_238,(uint *)pSVar14);
      }
      else {
        ::std::allocator<char>::allocator();
        local_2ca = 1;
        ::std::__cxx11::string::string((string *)&local_2c8,"",&local_2c9);
      }
      ::std::operator+(&local_288,&local_2a8,&local_2c8);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_2f0,"m",&local_2f1);
      ensure_valid_name((string *)local_268,this,&local_288,&local_2f0);
      ::std::__cxx11::string::~string((string *)&local_2f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      ::std::__cxx11::string::~string((string *)&local_288);
      ::std::__cxx11::string::~string((string *)&local_2c8);
      if ((local_2ca & 1) != 0) {
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      }
      ::std::__cxx11::string::~string((string *)&local_2a8);
      local_2f8 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_name((Compiler *)this,(TypeID)local_2f8,local_23c,(string *)local_268);
      if ((bVar2) || (*location == 0xffffffff)) {
        local_300 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self)
        ;
        bVar4 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)local_300,mbr_idx,DecorationLocation);
        if (bVar4) {
          local_304 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(entry_func->super_IVariant).self);
          uVar6 = Compiler::get_member_decoration
                            ((Compiler *)this,(TypeID)local_304,mbr_idx,DecorationLocation);
          *location = uVar6 + local_238;
          local_308 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(var_local->super_IVariant).self);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)local_308,local_23c,DecorationLocation,*location);
          mark_location_as_used_by_shader(this,*location,pSStack_f8,ib_var_ref_local._4_4_,false);
          *location = *location + 1;
        }
        else {
          local_30c = (var_type_local->super_IVariant).self.id;
          bVar4 = Compiler::has_decoration((Compiler *)this,(ID)local_30c,DecorationLocation);
          if (bVar4) {
            uVar6 = CompilerGLSL::get_accumulated_member_location
                              (&this->super_CompilerGLSL,(SPIRVariable *)var_type_local,mbr_idx,
                               (bool)(meta->strip_array & 1));
            *location = uVar6 + local_238;
            local_310 = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)&(var_local->super_IVariant).self);
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)local_310,local_23c,DecorationLocation,*location);
            mark_location_as_used_by_shader(this,*location,pSStack_f8,ib_var_ref_local._4_4_,false);
            *location = *location + 1;
          }
          else {
            bVar4 = false;
            if (bVar2) {
              bVar5 = Compiler::is_tessellation_shader((Compiler *)this);
              bVar4 = false;
              if ((bVar5) && (bVar4 = false, ib_var_ref_local._4_4_ == StorageClassInput)) {
                local_314 = local_5c;
                sVar11 = ::std::
                         unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                         ::count(&this->inputs_by_builtin,&local_314);
                bVar4 = sVar11 != 0;
              }
            }
            if (bVar4) {
              local_318 = local_5c;
              pmVar12 = ::std::
                        unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                        ::operator[](&this->inputs_by_builtin,&local_318);
              *location = pmVar12->location + local_238;
              local_31c = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(var_local->super_IVariant).self);
              Compiler::set_member_decoration
                        ((Compiler *)this,(TypeID)local_31c,local_23c,DecorationLocation,*location);
              mark_location_as_used_by_shader
                        (this,*location,pSStack_f8,ib_var_ref_local._4_4_,false);
              *location = *location + 1;
            }
            else {
              bVar4 = false;
              if (((bVar2) && (bVar4 = false, (this->capture_output_to_buffer & 1U) != 0)) &&
                 (bVar4 = false, ib_var_ref_local._4_4_ == StorageClassOutput)) {
                local_320 = local_5c;
                sVar11 = ::std::
                         unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                         ::count(&this->outputs_by_builtin,&local_320);
                bVar4 = sVar11 != 0;
              }
              if (bVar4) {
                local_324 = local_5c;
                pmVar12 = ::std::
                          unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                          ::operator[](&this->outputs_by_builtin,&local_324);
                *location = pmVar12->location + local_238;
                local_328 = (uint32_t)
                            TypedID::operator_cast_to_TypedID
                                      ((TypedID *)&(var_local->super_IVariant).self);
                Compiler::set_member_decoration
                          ((Compiler *)this,(TypeID)local_328,local_23c,DecorationLocation,*location
                          );
                mark_location_as_used_by_shader
                          (this,*location,pSStack_f8,ib_var_ref_local._4_4_,false);
                *location = *location + 1;
              }
              else if ((bVar2) &&
                      ((local_5c == BuiltInClipDistance || (local_5c == BuiltInCullDistance)))) {
                local_32c = (uint32_t)
                            TypedID::operator_cast_to_TypedID
                                      ((TypedID *)&(var_local->super_IVariant).self);
                Compiler::set_member_decoration
                          ((Compiler *)this,(TypeID)local_32c,local_23c,DecorationBuiltIn,local_5c);
                local_330 = (uint32_t)
                            TypedID::operator_cast_to_TypedID
                                      ((TypedID *)&(var_local->super_IVariant).self);
                Compiler::set_member_decoration
                          ((Compiler *)this,(TypeID)local_330,local_23c,DecorationIndex,local_238);
              }
            }
          }
        }
      }
      else {
        local_2fc = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)local_2fc,local_23c,DecorationLocation,*location);
        mark_location_as_used_by_shader(this,*location,pSStack_f8,ib_var_ref_local._4_4_,false);
        *location = *location + 1;
      }
      local_334 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
      bVar4 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)local_334,mbr_idx,DecorationComponent);
      if (bVar4) {
        pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar13,"DecorationComponent on matrices and arrays is not supported.");
        __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar4 = true;
      if (ib_var_ref_local._4_4_ == StorageClassInput) {
        local_338 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(var_type_local->super_IVariant).self);
        sVar10 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count(&this->pull_model_inputs,&local_338);
        bVar4 = sVar10 == 0;
      }
      if (bVar4) {
        if (local_501 != false) {
          TVar7 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)TVar7.id,local_23c,DecorationFlat,0);
        }
        if (local_511 != false) {
          TVar7 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)TVar7.id,local_23c,DecorationNoPerspective,0);
        }
        if (local_512 != false) {
          var_chain_1.field_2._12_4_ =
               TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)var_chain_1.field_2._12_4_,local_23c,
                     DecorationCentroid,0);
        }
        if (local_513 != false) {
          var_chain_1.field_2._8_4_ =
               TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)var_chain_1.field_2._8_4_,local_23c,DecorationSample,0
                    );
        }
      }
      uVar8 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_local->super_IVariant).self);
      uVar6 = local_23c;
      value = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(var_type_local->super_IVariant).self);
      Compiler::set_extended_member_decoration
                ((Compiler *)this,uVar8,uVar6,SPIRVCrossDecorationInterfaceOrigID,value);
      uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_local->super_IVariant).self);
      pacVar16 = (char (*) [2])(ulong)*var_mbr_idx;
      Compiler::set_extended_member_decoration
                ((Compiler *)this,uVar6,local_23c,SPIRVCrossDecorationInterfaceMemberIndex,
                 *var_mbr_idx);
      if (((meta->strip_array & 1U) == 0) && ((meta->allow_local_declaration & 1U) != 0)) {
        CompilerGLSL::to_member_name_abi_cxx11_
                  (&local_388,&this->super_CompilerGLSL,(SPIRType *)entry_func,mbr_idx);
        local_3aa = 0;
        if (bVar3) {
          join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    (&local_3a8,(spirv_cross *)0x48521e,(char (*) [2])&local_238,(uint *)0x490482,
                     pacVar16);
        }
        else {
          ::std::allocator<char>::allocator();
          local_3aa = 1;
          ::std::__cxx11::string::string((string *)&local_3a8,"",&local_3a9);
        }
        join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string>
                  ((string *)local_368,(spirv_cross *)var_chain_qual,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4aff3f,
                   (char (*) [2])&local_388,&local_3a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)var_type);
        ::std::__cxx11::string::~string((string *)&local_3a8);
        if ((local_3aa & 1) != 0) {
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
        }
        ::std::__cxx11::string::~string((string *)&local_388);
        if (ib_var_ref_local._4_4_ == StorageClassInput) {
          pVVar15 = &pSStack_58->fixup_hooks_in;
          local_448.var = (SPIRVariable *)var_type_local;
          local_448.is_centroid = local_512;
          local_448.is_sample = local_513;
          local_448.this = this;
          ::std::__cxx11::string::string((string *)&local_448.var_chain,(string *)local_368);
          ::std::__cxx11::string::string((string *)&local_448.ib_var_ref,(string *)ib_type_local);
          ::std::__cxx11::string::string((string *)&local_448.mbr_name,(string *)local_268);
          ::std::function<void()>::
          function<spirv_cross::CompilerMSL::add_composite_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&,spirv_cross::Bitset_const&)::__0,void>
                    ((function<void()> *)&local_3d0,&local_448);
          SmallVector<std::function<void_()>,_0UL>::push_back(pVVar15,&local_3d0);
          ::std::function<void_()>::~function(&local_3d0);
          add_composite_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&,spirv_cross::Bitset_const&)
          ::$_0::~__0((__0 *)&local_448);
        }
        else if (ib_var_ref_local._4_4_ == StorageClassOutput) {
          pVVar15 = &pSStack_58->fixup_hooks_out;
          local_500.flatten_from_ib_var =
               (bool)(flatten_from_ib_mbr_name.field_2._M_local_buf[0xf] & 1);
          local_500.this = this;
          ::std::__cxx11::string::string((string *)&local_500.ib_var_ref,(string *)ib_type_local);
          ::std::__cxx11::string::string((string *)&local_500.mbr_name,(string *)local_268);
          ::std::__cxx11::string::string
                    ((string *)&local_500.flatten_from_ib_mbr_name,(string *)local_120);
          local_500.i = local_238;
          ::std::__cxx11::string::string((string *)&local_500.var_chain,(string *)local_368);
          ::std::function<void()>::
          function<spirv_cross::CompilerMSL::add_composite_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&,spirv_cross::Bitset_const&)::__1,void>
                    ((function<void()> *)&local_468,&local_500);
          SmallVector<std::function<void_()>,_0UL>::push_back(pVVar15,&local_468);
          ::std::function<void_()>::~function(&local_468);
          add_composite_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&,spirv_cross::Bitset_const&)
          ::$_1::~__1((__1 *)&local_500);
        }
        ::std::__cxx11::string::~string((string *)local_368);
      }
      ::std::__cxx11::string::~string((string *)local_268);
    }
  }
LAB_0027a151:
  ::std::__cxx11::string::~string((string *)local_120);
  Bitset::~Bitset((Bitset *)local_d0);
  return;
}

Assistant:

void CompilerMSL::add_composite_member_variable_to_interface_block(StorageClass storage,
                                                                   const string &ib_var_ref, SPIRType &ib_type,
                                                                   SPIRVariable &var, SPIRType &var_type,
                                                                   uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                                   const string &mbr_name_qual,
                                                                   const string &var_chain_qual,
                                                                   uint32_t &location, uint32_t &var_mbr_idx,
                                                                   const Bitset &interpolation_qual)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat = interpolation_qual.get(DecorationFlat) ||
	               has_member_decoration(var_type.self, mbr_idx, DecorationFlat) ||
	               has_decoration(var.self, DecorationFlat);
	bool is_noperspective = interpolation_qual.get(DecorationNoPerspective) ||
	                        has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = interpolation_qual.get(DecorationCentroid) ||
	                   has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample = interpolation_qual.get(DecorationSample) ||
	                 has_member_decoration(var_type.self, mbr_idx, DecorationSample) ||
	                 has_decoration(var.self, DecorationSample);

	Bitset inherited_qual;
	if (is_flat)
		inherited_qual.set(DecorationFlat);
	if (is_noperspective)
		inherited_qual.set(DecorationNoPerspective);
	if (is_centroid)
		inherited_qual.set(DecorationCentroid);
	if (is_sample)
		inherited_qual.set(DecorationSample);

	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	bool mbr_is_indexable = false;
	uint32_t elem_cnt = 1;
	if (is_matrix(mbr_type))
	{
		if (is_array(mbr_type))
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

		mbr_is_indexable = true;
		elem_cnt = mbr_type.columns;
	}
	else if (is_array(mbr_type))
	{
		if (mbr_type.array.size() != 1)
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

		mbr_is_indexable = true;
		elem_cnt = to_array_size_literal(mbr_type);
	}

	auto *usable_type = &mbr_type;
	if (usable_type->pointer)
		usable_type = &get<SPIRType>(usable_type->parent_type);
	while (is_array(*usable_type) || is_matrix(*usable_type))
		usable_type = &get<SPIRType>(usable_type->parent_type);

	bool flatten_from_ib_var = false;
	string flatten_from_ib_mbr_name;

	if (storage == StorageClassOutput && is_builtin && builtin == BuiltInClipDistance)
	{
		// Also declare [[clip_distance]] attribute here.
		uint32_t clip_array_mbr_idx = uint32_t(ib_type.member_types.size());
		ib_type.member_types.push_back(mbr_type_id);
		set_member_decoration(ib_type.self, clip_array_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);

		flatten_from_ib_mbr_name = builtin_to_glsl(BuiltInClipDistance, StorageClassOutput);
		set_member_name(ib_type.self, clip_array_mbr_idx, flatten_from_ib_mbr_name);

		// When we flatten, we flatten directly from the "out" struct,
		// not from a function variable.
		flatten_from_ib_var = true;

		if (!msl_options.enable_clip_distance_user_varying)
			return;
	}

	// Recursively handle nested structures.
	if (mbr_type.basetype == SPIRType::Struct)
	{
		for (uint32_t i = 0; i < elem_cnt; i++)
		{
			string mbr_name = append_member_name(mbr_name_qual, var_type, mbr_idx) + (mbr_is_indexable ? join("_", i) : "");
			string var_chain = join(var_chain_qual, ".", to_member_name(var_type, mbr_idx), (mbr_is_indexable ? join("[", i, "]") : ""));
			uint32_t sub_mbr_cnt = uint32_t(mbr_type.member_types.size());
			for (uint32_t sub_mbr_idx = 0; sub_mbr_idx < sub_mbr_cnt; sub_mbr_idx++)
			{
				add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
																 var, mbr_type, sub_mbr_idx,
																 meta, mbr_name, var_chain,
																 location, var_mbr_idx, inherited_qual);
				// FIXME: Recursive structs and tessellation breaks here.
				var_mbr_idx++;
			}
		}
		return;
	}

	for (uint32_t i = 0; i < elem_cnt; i++)
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types.push_back(build_msl_interpolant_type(usable_type->self, is_noperspective));
		else
			ib_type.member_types.push_back(usable_type->self);

		// Give the member a name
		string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx) + (mbr_is_indexable ? join("_", i) : ""), "m");
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// Once we determine the location of the first member within nested structures,
		// from a var of the topmost structure, the remaining flattened members of
		// the nested structures will have consecutive location values. At this point,
		// we've recursively tunnelled into structs, arrays, and matrices, and are
		// down to a single location for each member now.
		if (!is_builtin && location != UINT32_MAX)
		{
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (has_member_decoration(var_type.self, mbr_idx, DecorationLocation))
		{
			location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation) + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (has_decoration(var.self, DecorationLocation))
		{
			location = get_accumulated_member_location(var, mbr_idx, meta.strip_array) + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
		{
			location = inputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
		{
			location = outputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance))
		{
			// Declare the Clip/CullDistance as [[user(clip/cullN)]].
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, i);
		}

		if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
			SPIRV_CROSS_THROW("DecorationComponent on matrices and arrays is not supported.");

		if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
		{
			// Copy interpolation decorations if needed
			if (is_flat)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
			if (is_noperspective)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
			if (is_centroid)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
			if (is_sample)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
		}

		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);

		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		if (!meta.strip_array && meta.allow_local_declaration)
		{
			string var_chain = join(var_chain_qual, ".", to_member_name(var_type, mbr_idx), (mbr_is_indexable ? join("[", i, "]") : ""));
			switch (storage)
			{
			case StorageClassInput:
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					string lerp_call;
					if (pull_model_inputs.count(var.self))
					{
						if (is_centroid)
							lerp_call = ".interpolate_at_centroid()";
						else if (is_sample)
							lerp_call = join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
						else
							lerp_call = ".interpolate_at_center()";
					}
					statement(var_chain, " = ", ib_var_ref, ".", mbr_name, lerp_call, ";");
				});
				break;

			case StorageClassOutput:
				entry_func.fixup_hooks_out.push_back([=]() {
					if (flatten_from_ib_var)
						statement(ib_var_ref, ".", mbr_name, " = ", ib_var_ref, ".", flatten_from_ib_mbr_name, "[", i, "];");
					else
						statement(ib_var_ref, ".", mbr_name, " = ", var_chain, ";");
				});
				break;

			default:
				break;
			}
		}
	}
}